

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O0

CVmHashEntry * __thiscall CVmHashTable::find_leading_substr(CVmHashTable *this,char *str,size_t len)

{
  CVmHashEntry *pCVar1;
  char *in_RDX;
  CVmHashTable *in_RSI;
  CVmHashEntry *entry;
  size_t sublen;
  char *str_00;
  
  str_00 = in_RDX;
  while( true ) {
    if (in_RDX == (char *)0x0) {
      return (CVmHashEntry *)0x0;
    }
    pCVar1 = find(in_RSI,str_00,(size_t)in_RDX);
    if (pCVar1 != (CVmHashEntry *)0x0) break;
    in_RDX = in_RDX + -1;
  }
  return pCVar1;
}

Assistant:

CVmHashEntry *CVmHashTable::find_leading_substr(const char *str, size_t len)
{
    size_t sublen;
    CVmHashEntry *entry;

    /* 
     *   try to find each leading substring, starting with the longest,
     *   decreasing by one character on each iteration, until we've used
     *   the whole string 
     */
    for (sublen = len ; sublen > 0 ; --sublen)
    {
        /* if this substring matches, use it */
        if ((entry = find(str, sublen)) != 0)
            return entry;
    }

    /* we didn't find it */
    return 0;
}